

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupTestCase.cpp
# Opt level: O2

void __thiscall SuiteGroupTests::Testcopy::Testcopy(Testcopy *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"copy","GroupTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/GroupTestCase.cpp"
             ,0x23);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031d850;
  return;
}

Assistant:

TEST(copy)
{
  Group object(1, 10, message_order(10, 9, 8, 7, 0));
  object.setField(10, "10");
  object.setField(9, "9");
  object.setField(8, "8");
  object.setField(7, "7");

  std::string originalString;
  object.calculateString( originalString );
  
  Group copy = object;

  std::string copyString;
  copy.calculateString( copyString );

  CHECK_EQUAL( originalString, copyString );
}